

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_utf8_substring_op(sexp ctx,sexp self,sexp_sint_t n,sexp str,sexp start,sexp end)

{
  sexp psVar1;
  sexp_uint_t type_id;
  sexp_sint_t n_00;
  sexp_sint_t extraout_RDX;
  sexp_sint_t n_01;
  sexp psVar2;
  
  if ((((ulong)str & 3) == 0) && (str->tag == 9)) {
    if (((ulong)start & 1) != 0) {
      psVar1 = sexp_string_index_to_cursor(ctx,self,n,str,start);
      if (((((ulong)psVar1 & 3) != 0) || (psVar2 = psVar1, psVar1->tag != 0x13)) &&
         ((n_01 = n_00, ((ulong)end & 1) == 0 ||
          ((end = sexp_string_index_to_cursor(ctx,self,n_00,str,end), n_01 = extraout_RDX,
           ((ulong)end & 3) != 0 || (psVar2 = end, end->tag != 0x13)))))) {
        psVar1 = sexp_substring_op(ctx,self,n_01,str,psVar1,end);
        return psVar1;
      }
      return psVar2;
    }
    type_id = 2;
  }
  else {
    type_id = 9;
    start = str;
  }
  psVar1 = sexp_type_exception(ctx,self,type_id,start);
  return psVar1;
}

Assistant:

sexp sexp_utf8_substring_op (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp start, sexp end) {
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, start);
  start = sexp_string_index_to_cursor(ctx, self, n, str, start);
  if (sexp_exceptionp(start)) return start;
  if (sexp_fixnump(end)) {
    end = sexp_string_index_to_cursor(ctx, self, n, str, end);
    if (sexp_exceptionp(end)) return end;
  }
  return sexp_substring_op(ctx, self, n, str, start, end);
}